

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_response.h
# Opt level: O3

string __thiscall CreateResponse::ToString(CreateResponse *this)

{
  unsigned_long_long uVar1;
  _Alloc_hider _Var2;
  unsigned_long_long *puVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined1 local_70 [16];
  undefined1 local_60 [24];
  string local_48;
  _func_int **local_40;
  unsigned_long_long local_38;
  unsigned_long_long local_30;
  long local_28;
  
  FileInfo::ToString((FileInfo *)&local_40);
  puVar3 = (unsigned_long_long *)std::string::insert((ulong)&local_40,(char *)0x0,0x127503);
  local_38 = *puVar3;
  *puVar3 = (unsigned_long_long)std::string::insert;
  puVar3 = (unsigned_long_long *)std::string::append((char *)&local_38,0x12802c);
  local_60._8_8_ = *puVar3;
  *puVar3 = (unsigned_long_long)std::string::insert;
  FileInfo::ToString((FileInfo *)local_60);
  if ((*(_func_int **)(local_60._8_8_ - 0x10) <
       *(_func_int **)(local_60._0_8_ + -0x18) + *(long *)(local_60._8_8_ - 0x18)) &&
     (*(_func_int **)(local_60._0_8_ + -0x18) + *(long *)(local_60._8_8_ - 0x18) <=
      *(_func_int **)(local_60._0_8_ + -0x10))) {
    puVar3 = (unsigned_long_long *)
             std::string::insert((ulong)local_60,(string *)0x0,(ulong)(local_60 + 8),0);
  }
  else {
    puVar3 = (unsigned_long_long *)std::string::append((string *)(local_60 + 8));
  }
  local_30 = *puVar3;
  *puVar3 = (unsigned_long_long)std::string::insert;
  puVar3 = (unsigned_long_long *)std::string::append((char *)&local_30,0x12802c);
  uVar1 = *puVar3;
  *puVar3 = (unsigned_long_long)std::string::insert;
  local_60._16_8_ = uVar1;
  BlockInfo::ToString((BlockInfo *)(local_70 + 8));
  if ((*(_func_int **)(uVar1 - 0x10) <
       *(_func_int **)(local_70._8_8_ + -0x18) + *(long *)(uVar1 - 0x18)) &&
     (*(_func_int **)(local_70._8_8_ + -0x18) + *(long *)(uVar1 - 0x18) <=
      *(_func_int **)(local_70._8_8_ + -0x10))) {
    plVar4 = (long *)std::string::insert((ulong)(local_70 + 8),(string *)0x0,
                                         (ulong)(local_60 + 0x10),0);
  }
  else {
    plVar4 = (long *)std::string::append((string *)(local_60 + 0x10));
  }
  local_28 = *plVar4;
  *plVar4 = (long)std::string::insert;
  puVar3 = (unsigned_long_long *)std::string::append((char *)&local_28,0x12802c);
  _Var2._M_p = (char *)*puVar3;
  *puVar3 = (unsigned_long_long)std::string::insert;
  local_48._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)_Var2._M_p;
  BlockInfo::ToString((BlockInfo *)local_70);
  if ((*(_func_int **)(_Var2._M_p + -0x10) <
       *(_func_int **)(local_70._0_8_ + -0x18) + *(long *)(_Var2._M_p + -0x18)) &&
     (*(_func_int **)(local_70._0_8_ + -0x18) + *(long *)(_Var2._M_p + -0x18) <=
      *(_func_int **)(local_70._0_8_ + -0x10))) {
    puVar5 = (undefined8 *)std::string::insert((ulong)local_70,(string *)0x0,(ulong)&local_48,0);
  }
  else {
    puVar5 = (undefined8 *)std::string::append(&local_48);
  }
  (this->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage = (_func_int **)*puVar5;
  *puVar5 = std::string::insert;
  std::string::_Rep::_M_dispose((allocator *)(local_70._0_8_ + -0x18));
  std::string::_Rep::_M_dispose((allocator *)((long)local_48._M_dataplus._M_p - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_28 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_70._8_8_ + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_60._16_8_ - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_30 - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_60._0_8_ + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_60._8_8_ - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_38 - 0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_40 + -3));
  return (string)(_Alloc_hider)this;
}

Assistant:

virtual string ToString() const {
    return "CreateResponse:: " + file_info_.ToString() + ", " +
           parent_info_.ToString() + ", " + file_block_->ToString() + ", " +
           parent_block_->ToString();
  }